

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_255ac4::JsonString::JsonString(JsonString *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JsonString_001c05a8;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  (this->proxy_).original_ = &(this->callbacks_).super_mock_json_callbacks;
  return;
}

Assistant:

JsonString ()
                : proxy_{callbacks_} {}